

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

bool __thiscall Rml::DataViewAttributeIf::Update(DataViewAttributeIf *this,DataModel *model)

{
  char cVar1;
  bool bVar2;
  String *name;
  Element *element_00;
  DataExpression *this_00;
  Variant *pVVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_82;
  byte local_81;
  undefined1 local_80 [6];
  bool is_set;
  bool value;
  DataExpressionInterface expr_interface;
  Element *element;
  Variant variant;
  bool result;
  String *attribute_name;
  DataModel *model_local;
  DataViewAttributeIf *this_local;
  
  name = DataViewCommon::GetModifier_abi_cxx11_(&this->super_DataViewCommon);
  variant.data[0x1f] = '\0';
  Variant::Variant((Variant *)&element);
  element_00 = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface
            ((DataExpressionInterface *)local_80,model,element_00,(Event *)0x0);
  if (element_00 != (Element *)0x0) {
    this_00 = DataViewCommon::GetExpression(&this->super_DataViewCommon);
    bVar2 = DataExpression::Run(this_00,(DataExpressionInterface *)local_80,(Variant *)&element);
    if (bVar2) {
      local_81 = Variant::Get<bool>((Variant *)&element,false);
      pVVar3 = Element::GetAttribute(element_00,name);
      local_82 = pVVar3 != (Variant *)0x0;
      if (local_82 != (local_81 & 1)) {
        if ((local_81 & 1) == 0) {
          Element::RemoveAttribute(element_00,name);
        }
        else {
          ::std::__cxx11::string::string((string *)&local_a8);
          Element::SetAttribute<std::__cxx11::string>(element_00,name,&local_a8);
          ::std::__cxx11::string::~string((string *)&local_a8);
        }
        variant.data[0x1f] = '\x01';
      }
    }
  }
  cVar1 = variant.data[0x1f];
  Variant::~Variant((Variant *)&element);
  return (bool)(cVar1 & 1);
}

Assistant:

bool DataViewAttributeIf::Update(DataModel& model)
{
	const String& attribute_name = GetModifier();
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const bool value = variant.Get<bool>();
		const bool is_set = static_cast<bool>(element->GetAttribute(attribute_name));
		if (is_set != value)
		{
			if (value)
				element->SetAttribute(attribute_name, String());
			else
				element->RemoveAttribute(attribute_name);
			result = true;
		}
	}
	return result;
}